

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_match.h
# Opt level: O0

bool booster::regex_match<booster::regex>(string *s,smatch *m,regex *r,int flags)

{
  byte bVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  begin;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  long lVar2;
  char *in_RDX;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *in_RSI;
  bool res;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> map;
  undefined1 local_40 [32];
  char *local_20;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *local_18;
  byte local_1;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)0x11380f);
  begin._M_current = (char *)std::__cxx11::string::c_str();
  this = (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)std::__cxx11::string::c_str();
  lVar2 = std::__cxx11::string::size();
  bVar1 = booster::regex::match
                    (local_20,begin._M_current,(vector *)((long)&(this->begin_)._M_current + lVar2),
                     (int)local_40);
  local_1 = (bVar1 & 1) != 0;
  if ((bool)local_1) {
    std::__cxx11::string::begin();
    std::__cxx11::string::end();
    match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::assign(this,begin,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_20,local_18);
  }
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~vector
            ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)begin._M_current)
  ;
  return (bool)(local_1 & 1);
}

Assistant:

bool regex_match(std::string const &s,smatch &m, Regex const &r,int flags = 0)
	{
		std::vector<std::pair<int,int> > map;
		bool res = r.match(s.c_str(),s.c_str()+s.size(),map,flags);
		if(!res) return false;
		m.assign(s.begin(),s.end(),map);
		return true;
	}